

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzwrite.c
# Opt level: O0

int gz_zero(gz_state *state,off64_t len)

{
  bool bVar1;
  int iVar2;
  long in_RSI;
  long in_RDI;
  zng_stream *strm;
  uint n;
  int first;
  uint local_2c;
  long local_18;
  int flush;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  flush = (int)((ulong)in_RDI >> 0x20);
  if ((*(int *)(in_RDI + 0x88) != 0) &&
     (iVar2 = gz_comp((gz_state *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                      flush), iVar2 == -1)) {
    return -1;
  }
  bVar1 = true;
  local_18 = in_RSI;
  while( true ) {
    if (local_18 == 0) {
      return 0;
    }
    if (local_18 < (long)(ulong)*(uint *)(in_RDI + 0x28)) {
      local_2c = (uint)local_18;
    }
    else {
      local_2c = *(uint *)(in_RDI + 0x28);
    }
    if (bVar1) {
      memset(*(void **)(in_RDI + 0x30),0,(ulong)local_2c);
      bVar1 = false;
    }
    *(uint *)(in_RDI + 0x88) = local_2c;
    *(undefined8 *)(in_RDI + 0x80) = *(undefined8 *)(in_RDI + 0x30);
    *(ulong *)(in_RDI + 0x10) = (ulong)local_2c + *(long *)(in_RDI + 0x10);
    iVar2 = gz_comp((gz_state *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),flush)
    ;
    if (iVar2 == -1) break;
    local_18 = local_18 - (ulong)local_2c;
  }
  return -1;
}

Assistant:

static int gz_zero(gz_state *state, z_off64_t len) {
    int first;
    unsigned n;
    PREFIX3(stream) *strm = &(state->strm);

    /* consume whatever's left in the input buffer */
    if (strm->avail_in && gz_comp(state, Z_NO_FLUSH) == -1)
        return -1;

    /* compress len zeros (len guaranteed > 0) */
    first = 1;
    while (len) {
        n = GT_OFF(state->size) || (z_off64_t)state->size > len ? (unsigned)len : state->size;
        if (first) {
            memset(state->in, 0, n);
            first = 0;
        }
        strm->avail_in = n;
        strm->next_in = state->in;
        state->x.pos += n;
        if (gz_comp(state, Z_NO_FLUSH) == -1)
            return -1;
        len -= n;
    }
    return 0;
}